

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pax_filename_encoding.c
# Opt level: O3

void test_pax_filename_encoding_KOI8R(void)

{
  int iVar1;
  char *pcVar2;
  archive *_a;
  archive_conflict *a;
  archive_entry *entry;
  size_t used;
  char buff [4096];
  size_t local_1030;
  undefined1 local_1028 [512];
  undefined1 local_e28 [3584];
  
  pcVar2 = setlocale(6,"ru_RU.KOI8-R");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                   ,L'ř');
    test_skipping("KOI8-R locale not available on this system.");
    return;
  }
  _a = archive_write_new();
  iVar1 = archive_write_set_format_pax(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'ş',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_pax(a)",
                      (void *)0x0);
  iVar1 = archive_write_set_options(_a,"hdrcharset=UTF-8");
  if (iVar1 != 0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                   ,L'š');
    test_skipping("This system cannot convert character-set from KOI8-R to UTF-8.");
    archive_write_free(_a);
    return;
  }
  archive_write_free(_a);
  a = (archive_conflict *)archive_write_new();
  iVar1 = archive_write_set_format_pax((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'ū',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_pax(a)",
                      (void *)0x0);
  iVar1 = archive_write_open_memory((archive *)a,local_1028,0x1000,&local_1030);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'ŭ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
  entry = archive_entry_new2(a);
  archive_entry_set_pathname(entry,anon_var_dwarf_46063);
  archive_entry_set_filetype(entry,0x8000);
  archive_entry_set_size(entry,0);
  iVar1 = archive_write_header((archive *)a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'ų',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",(void *)0x0
                     );
  archive_entry_free(entry);
  iVar1 = archive_write_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'ŵ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'Ź',local_e28,"buff + 512",anon_var_dwarf_4c2fb,
                      "\"15 path=\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\\x0A\"",0xf,"15",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_pax_filename_encoding_KOI8R)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "ru_RU.KOI8-R")) {
		skipping("KOI8-R locale not available on this system.");
		return;
	}

	/* Check if the platform completely supports the string conversion. */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_pax(a));
	if (archive_write_set_options(a, "hdrcharset=UTF-8") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " from KOI8-R to UTF-8.");
		archive_write_free(a);
		return;
	}
	archive_write_free(a);

	/* Re-create a write archive object since filenames should be written
	 * in UTF-8 by default. */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_pax(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	archive_entry_set_pathname(entry, "\xD0\xD2\xC9");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Above three characters in KOI8-R should translate to the following
	 * three characters (two bytes each) in UTF-8. */
	assertEqualMem(buff + 512, "15 path=\xD0\xBF\xD1\x80\xD0\xB8\x0A", 15);
}